

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O2

int testNumberOfNeighborsWithDefaultValueInSet(void)

{
  bool bVar1;
  KNearestNeighborsClassifier *this;
  Int64Parameter *this_00;
  Int64Set *pIVar2;
  NearestNeighborsIndex *this_01;
  SingleKdTreeIndex *pSVar3;
  ostream *poVar4;
  Model m1;
  Result res;
  
  CoreML::Specification::Model::Model(&m1);
  CoreML::KNNValidatorTests::generateInterface(&m1);
  this = CoreML::Specification::Model::mutable_knearestneighborsclassifier(&m1);
  this_00 = CoreML::Specification::KNearestNeighborsClassifier::mutable_numberofneighbors(this);
  pIVar2 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
  CoreML::Specification::Int64Set::add_values(pIVar2,1);
  pIVar2 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
  CoreML::Specification::Int64Set::add_values(pIVar2,4);
  pIVar2 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
  CoreML::Specification::Int64Set::add_values(pIVar2,7);
  this_00->defaultvalue_ = 4;
  CoreML::Specification::KNearestNeighborsClassifier::mutable_uniformweighting(this);
  this_01 = CoreML::Specification::KNearestNeighborsClassifier::mutable_nearestneighborsindex(this);
  CoreML::Specification::NearestNeighborsIndex::mutable_squaredeuclideandistance(this_01);
  pSVar3 = CoreML::Specification::NearestNeighborsIndex::mutable_singlekdtreeindex(this_01);
  pSVar3->leafsize_ = 0x1e;
  CoreML::Specification::KNearestNeighborsClassifier::set_defaultstringlabel(this,"Default");
  CoreML::validate<(MLModelType)404>(&res,&m1);
  bVar1 = CoreML::Result::good(&res);
  if (!bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x1ff);
    poVar4 = std::operator<<(poVar4,": error: ");
    poVar4 = std::operator<<(poVar4,"(res).good()");
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return (uint)!bVar1;
}

Assistant:

int testNumberOfNeighborsWithDefaultValueInSet() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    auto *numberOfNeighbors = knnClassifier->mutable_numberofneighbors();
    numberOfNeighbors->mutable_set()->add_values(1);
    numberOfNeighbors->mutable_set()->add_values(4);
    numberOfNeighbors->mutable_set()->add_values(7);
    numberOfNeighbors->set_defaultvalue(4);

    knnClassifier->mutable_uniformweighting();

    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    nnIndex->mutable_squaredeuclideandistance();
    auto *kdTree = nnIndex->mutable_singlekdtreeindex();
    kdTree->set_leafsize(30);
    knnClassifier->set_defaultstringlabel("Default");

    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_GOOD(res);

    return 0;

}